

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_keeper.h
# Opt level: O2

void __thiscall
mp::
ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>_>
::StoreSolverExpression
          (ConstraintKeeper<mp::FlatCvtImpl<mp::FlatConverter,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_TestBackendAcceptingConstraints<mp::AlgebraicConstraint<mp::QuadAndLinTerms,_mp::AlgConRange>_>,_mp::CustomStaticConstraint<std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_mp::QuadraticConeId>_>
           *this,BasicFlatModelAPI *be,int i,void *pexpr)

{
  return;
}

Assistant:

void StoreSolverExpression(
      BasicFlatModelAPI& be, int i, void* pexpr) override {
    if constexpr (ExpressionAcceptanceLevel::NotAccepted
        != Backend::ExpressionInterfaceAcceptanceLevel()) {
      assert(!cons_[i].IsRedundant());
      assert(!cons_[i].IsExprAdded());
      cons_[i].MarkExprAdded();
      *(typename Backend::Expr*)pexpr =
          static_cast<Backend&>(be).AddExpression(cons_[i].GetExpr());
    }
  }